

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.c
# Opt level: O1

int readParameters(char *inputFile,double *init,lattice *grid,fluidSim *sim,bndCond *bCond,
                  double *delt,double *t_end)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined1 auVar3 [16];
  byte bVar4;
  int iVar5;
  FILE *__stream;
  __ssize_t _Var6;
  fluidSim *pfVar7;
  fluidSim *pfVar8;
  byte bVar9;
  int iVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined1 auVar13 [16];
  double value;
  char *variable;
  size_t len;
  double local_88;
  fluidSim *local_80;
  bndCond *local_78;
  byte *local_70;
  fluidSim *local_68;
  lattice *local_60;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  fluidSim *local_40;
  size_t local_38;
  
  local_68 = (fluidSim *)init;
  __stream = fopen(inputFile,"r");
  if (__stream == (FILE *)0x0) {
    iVar10 = 0;
    printf("The file \"%s\" probably doesn\'t exist. Please check your input!\n",inputFile);
  }
  else {
    iVar10 = 0;
    local_70 = (byte *)0x0;
    local_38 = 0;
    local_60 = grid;
    _Var6 = getline((char **)&local_70,&local_38,__stream);
    if (_Var6 < 1) {
      local_58 = 0;
      uStack_54 = 0;
      uStack_50 = 0;
      uStack_4c = 0;
    }
    else {
      local_58 = 0;
      uStack_54 = 0;
      uStack_50 = 0;
      uStack_4c = 0;
      iVar10 = 0;
      local_80 = sim;
      local_78 = bCond;
      local_40 = (fluidSim *)delt;
      do {
        if (*local_70 == 0x23) goto LAB_00105e62;
        iVar5 = __isoc99_sscanf(local_70,"%*s%*[ \t]%lg",&local_88);
        if (iVar5 != 1) {
          printf("Malformed input: %s\n");
          goto LAB_00105e62;
        }
        bVar4 = *local_70;
        uVar11 = SUB84(local_88,0);
        uVar12 = (undefined4)((ulong)local_88 >> 0x20);
        switch(bVar4) {
        case 0x61:
          local_80->alpha = local_88;
          break;
        case 0x62:
        case 99:
        case 0x66:
        case 0x67:
        case 0x68:
        case 0x6b:
        case 0x6c:
        case 0x6d:
        case 0x6e:
        case 0x70:
        case 0x71:
        case 0x72:
        case 0x73:
        case 0x75:
        case 0x76:
switchD_00105c78_caseD_62:
          printf("Found unexpected Variable %s of value %lg.\n",uVar11);
          goto LAB_00105e62;
        case 100:
          local_80->dt = local_88;
          pfVar8 = local_40;
          goto LAB_00105e00;
        case 0x65:
          local_80->eps = local_88;
          break;
        case 0x69:
          if (local_70[1] == 0x6d) {
            local_60->imax = (int)local_88;
          }
          else {
            local_80->itmax = (int)local_88;
          }
          break;
        case 0x6a:
          local_60->jmax = (int)local_88;
          break;
        case 0x6f:
          local_80->omega = local_88;
          break;
        case 0x74:
          pfVar8 = (fluidSim *)t_end;
          pfVar7 = local_80;
          if (local_70[1] != 0x61) goto LAB_00105e00;
LAB_00105ddb:
          pfVar7->tau = local_88;
          break;
        case 0x77:
          switch((byte)(local_70[1] + 0x9e) >> 1 | local_70[1] << 7) {
          case 0:
            bVar4 = ((byte)(long)local_88 & 3) << 4;
            bVar9 = *(byte *)local_78 & 0xcf;
            break;
          default:
            goto switchD_00105d4f_caseD_1;
          case 5:
            bVar4 = (char)(long)local_88 << 6;
            bVar9 = *(byte *)local_78 & 0x3f;
            break;
          case 8:
            bVar4 = ((byte)(long)local_88 & 3) << 2;
            bVar9 = *(byte *)local_78 & 0xf3;
            break;
          case 9:
            bVar4 = (byte)(long)local_88 & 3;
            bVar9 = *(byte *)local_78 & 0xfc;
          }
          *(byte *)local_78 = bVar9 | bVar4;
          break;
        case 0x78:
          local_58 = uVar11;
          uStack_54 = uVar12;
          break;
        case 0x79:
          uStack_50 = uVar11;
          uStack_4c = uVar12;
          break;
        default:
          switch(bVar4) {
          case 0x50:
            local_68->dt = local_88;
            break;
          case 0x51:
          case 0x53:
          case 0x54:
            goto switchD_00105c78_caseD_62;
          case 0x52:
            pfVar8 = local_80;
            goto LAB_00105e00;
          case 0x55:
            pfVar8 = local_68;
LAB_00105e00:
            pfVar8->Re = local_88;
            break;
          case 0x56:
            pfVar7 = local_68;
            goto LAB_00105ddb;
          default:
            if (bVar4 != 0x47) goto switchD_00105c78_caseD_62;
            if (local_70[1] == 0x58) {
              local_80->GX = local_88;
            }
            else {
              local_80->GY = local_88;
            }
          }
        }
switchD_00105d4f_caseD_1:
        iVar10 = iVar10 + 1;
LAB_00105e62:
        _Var6 = getline((char **)&local_70,&local_38,__stream);
      } while (0 < _Var6);
    }
    fclose(__stream);
    free(local_70);
    uVar1 = local_60->imax;
    uVar2 = local_60->jmax;
    auVar3._4_4_ = uStack_54;
    auVar3._0_4_ = local_58;
    auVar3._8_4_ = uStack_50;
    auVar3._12_4_ = uStack_4c;
    auVar13._8_4_ = SUB84((double)(int)uVar2,0);
    auVar13._0_8_ = (double)(int)uVar1;
    auVar13._12_4_ = (int)((ulong)(double)(int)uVar2 >> 0x20);
    auVar13 = divpd(auVar3,auVar13);
    local_60->delx = (double)auVar13._0_8_;
    local_60->dely = (double)auVar13._8_8_;
  }
  return iVar10;
}

Assistant:

int readParameters (const char *inputFile, REAL *init,
		lattice *grid, fluidSim *sim, bndCond *bCond,
		REAL *delt, REAL *t_end)
{
	FILE *input = fopen(inputFile,"r");
	if (input == NULL)
	{
		printf("The file \"%s\" probably doesn't exist. Please check your input!\n",inputFile);
		return 0;
	}
	REAL value;
	REAL xlength = 0, ylength = 0;
	int readVars = 0;

	char *variable = NULL;
	size_t len = 0;

	while (getline(&variable, &len, input) > 0)
	{
		if (variable[0] == '#')
			continue;
		if (sscanf(variable, "%*s%*[ \t]%lg", &value) != 1)
		{
			printf("Malformed input: %s\n",variable);
			continue;
		}
		switch(variable[0])
		{
			case 'x':
				xlength = value;
				break;
			case 'y':
				ylength = value;
				break;
			case 'i':
				if (variable[1] == 'm') grid->imax = (int)value;
				else sim->itmax = (int)value;
				break;
			case 'j':
				grid->jmax = (int)value;
				break;
			case 'e':
				sim->eps = value;
				break;
			case 'o':
				sim->omega = value;
				break;
			case 'a':
				sim->alpha = value;
				break;
			case 'd':
				*delt = sim->dt = value;
				break;
			case 't':
				if (variable[1] == 'a') sim->tau = value;
				else *t_end = value;
				break;
			case 'R':
				sim->Re = value;
				break;
			case 'U':
				init[0] = value;
				break;
			case 'V':
				init[1] = value;
				break;
			case 'P':
				init[2] = value;
				break;
			case 'G':
				if (variable[1] == 'X') sim->GX = value;
				else sim->GY = value;
				break;
			case 'w':
				if (variable[1] == 't') bCond->wt = (unsigned)value;
				else if (variable[1] == 'b') bCond->wb = (unsigned)value;
				else if (variable[1] == 'r') bCond->wr = (unsigned)value;
				else if (variable[1] == 'l') bCond->wl = (unsigned)value;
				break;
			default:
				printf("Found unexpected Variable %s of value %lg.\n",variable,value);
				continue;
		}
		readVars++;
	}
	fclose(input);
	free(variable);
	grid->delx = xlength/grid->imax;
	grid->dely = ylength/grid->jmax;
	return readVars;
}